

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenI31Get(BinaryenModuleRef module,BinaryenExpressionRef i31,bool signed_)

{
  I31Get *this;
  
  this = (I31Get *)MixedArena::allocSpace(&module->allocator,0x20,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression._id = I31GetId;
  (this->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id = 0;
  this->i31 = i31;
  this->signed_ = signed_;
  wasm::I31Get::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenI31Get(BinaryenModuleRef module,
                                     BinaryenExpressionRef i31,
                                     bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeI31Get((Expression*)i31, signed_ != 0));
}